

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

int bcf_hdr_sync(bcf_hdr_t *h)

{
  uint *puVar1;
  uint uVar2;
  bcf_idpair_t *pbVar3;
  long lVar4;
  long lVar5;
  byte bVar6;
  ulong uVar7;
  int *piVar8;
  uint uVar9;
  long lVar10;
  
  lVar10 = 0;
  do {
    puVar1 = (uint *)h->dict[lVar10];
    if ((ulong)*puVar1 == 0) {
      uVar9 = 0xffffffff;
    }
    else {
      uVar9 = 0xffffffff;
      lVar4 = 0x28;
      bVar6 = 0;
      uVar7 = 0;
      do {
        if (((*(uint *)(*(long *)(puVar1 + 4) + (uVar7 >> 4 & 0xfffffff) * 4) >> (bVar6 & 0x1e) & 3)
             == 0) && ((int)uVar9 <= (int)*(uint *)(*(long *)(puVar1 + 8) + lVar4))) {
          uVar9 = *(uint *)(*(long *)(puVar1 + 8) + lVar4);
        }
        uVar7 = uVar7 + 1;
        lVar4 = lVar4 + 0x30;
        bVar6 = bVar6 + 2;
      } while (*puVar1 != uVar7);
    }
    if (h->n[lVar10] <= (int)uVar9) {
      pbVar3 = (bcf_idpair_t *)realloc(h->id[lVar10],(ulong)(uVar9 + 1) << 4);
      h->id[lVar10] = pbVar3;
      for (uVar2 = h->n[lVar10]; uVar2 <= uVar9; uVar2 = uVar2 + 1) {
        h->id[lVar10][uVar2].key = (char *)0x0;
        h->id[lVar10][uVar2].val = (bcf_idinfo_t *)0x0;
      }
      h->n[lVar10] = uVar9 + 1;
    }
    uVar9 = *puVar1;
    if ((ulong)uVar9 != 0) {
      lVar4 = *(long *)(puVar1 + 4);
      lVar5 = 0x28;
      bVar6 = 0;
      uVar7 = 0;
      do {
        if ((*(uint *)(lVar4 + (uVar7 >> 4 & 0xfffffff) * 4) >> (bVar6 & 0x1e) & 3) == 0) {
          piVar8 = (int *)(*(long *)(puVar1 + 8) + lVar5);
          h->id[lVar10][*piVar8].key = *(char **)(*(long *)(puVar1 + 6) + uVar7 * 8);
          h->id[lVar10][*piVar8].val = (bcf_idinfo_t *)(piVar8 + -10);
        }
        uVar7 = uVar7 + 1;
        lVar5 = lVar5 + 0x30;
        bVar6 = bVar6 + 2;
      } while (uVar9 != uVar7);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  h->dirty = 0;
  return 0;
}

Assistant:

int bcf_hdr_sync(bcf_hdr_t *h)
{
    int i;
    for (i = 0; i < 3; i++)
    {
        vdict_t *d = (vdict_t*)h->dict[i];
        khint_t k;

        // find out the largest id, there may be holes because of IDX
        int max_id = -1;
        for (k=kh_begin(d); k<kh_end(d); k++)
        {
            if (!kh_exist(d,k)) continue;
            if ( max_id < kh_val(d,k).id ) max_id = kh_val(d,k).id;
        }
        if ( max_id >= h->n[i] )
        {
            h->id[i] = (bcf_idpair_t*)realloc(h->id[i], (max_id+1)*sizeof(bcf_idpair_t));
            for (k=h->n[i]; k<=max_id; k++)
            {
                h->id[i][k].key = NULL;
                h->id[i][k].val = NULL;
            }
            h->n[i] = max_id+1;
        }
        for (k=kh_begin(d); k<kh_end(d); k++)
        {
            if (!kh_exist(d,k)) continue;
            h->id[i][kh_val(d,k).id].key = kh_key(d,k);
            h->id[i][kh_val(d,k).id].val = &kh_val(d,k);
        }
    }
    h->dirty = 0;
    return 0;
}